

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerRollback(Pager *pPager)

{
  Pager *in_RDI;
  Pager *unaff_retaddr;
  int in_stack_00000008;
  int eState;
  int rc2;
  int rc;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI->eState == '\x06') {
    iVar1 = in_RDI->errCode;
  }
  else if (in_RDI->eState < 2) {
    iVar1 = 0;
  }
  else {
    if (in_RDI->pWal == (Wal *)0x0) {
      if ((in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0) || (in_RDI->eState == '\x02')) {
        in_stack_ffffffffffffffe4 = (uint)in_RDI->eState;
        iVar1 = pager_end_transaction
                          ((Pager *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        if ((in_RDI->memDb == '\0') && (2 < (int)in_stack_ffffffffffffffe4)) {
          in_RDI->errCode = 4;
          in_RDI->eState = '\x06';
          setGetterMethod(in_RDI);
          return iVar1;
        }
      }
      else {
        pager_playback(unaff_retaddr,in_stack_fffffffffffffffc);
      }
    }
    else {
      sqlite3PagerSavepoint(_rc2,eState,in_stack_00000008);
      pager_end_transaction
                ((Pager *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    iVar1 = pager_error((Pager *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerRollback(Pager *pPager){
  int rc = SQLITE_OK;                  /* Return code */
  PAGERTRACE(("ROLLBACK %d\n", PAGERID(pPager)));

  /* PagerRollback() is a no-op if called in READER or OPEN state. If
  ** the pager is already in the ERROR state, the rollback is not
  ** attempted here. Instead, the error code is returned to the caller.
  */
  assert( assert_pager_state(pPager) );
  if( pPager->eState==PAGER_ERROR ) return pPager->errCode;
  if( pPager->eState<=PAGER_READER ) return SQLITE_OK;

  if( pagerUseWal(pPager) ){
    int rc2;
    rc = sqlite3PagerSavepoint(pPager, SAVEPOINT_ROLLBACK, -1);
    rc2 = pager_end_transaction(pPager, pPager->setSuper, 0);
    if( rc==SQLITE_OK ) rc = rc2;
  }else if( !isOpen(pPager->jfd) || pPager->eState==PAGER_WRITER_LOCKED ){
    int eState = pPager->eState;
    rc = pager_end_transaction(pPager, 0, 0);
    if( !MEMDB && eState>PAGER_WRITER_LOCKED ){
      /* This can happen using journal_mode=off. Move the pager to the error
      ** state to indicate that the contents of the cache may not be trusted.
      ** Any active readers will get SQLITE_ABORT.
      */
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
      return rc;
    }
  }else{
    rc = pager_playback(pPager, 0);
  }

  assert( pPager->eState==PAGER_READER || rc!=SQLITE_OK );
  assert( rc==SQLITE_OK || rc==SQLITE_FULL || rc==SQLITE_CORRUPT
          || rc==SQLITE_NOMEM || (rc&0xFF)==SQLITE_IOERR
          || rc==SQLITE_CANTOPEN
  );

  /* If an error occurs during a ROLLBACK, we can no longer trust the pager
  ** cache. So call pager_error() on the way out to make any error persistent.
  */
  return pager_error(pPager, rc);
}